

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svectorbase.h
# Opt level: O1

SVectorBase<double> * __thiscall
soplex::SVectorBase<double>::operator=
          (SVectorBase<double> *this,
          SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
          *sv)

{
  bool bVar1;
  int iVar2;
  Nonzero<double> *pNVar3;
  Nonzero<double> *pNVar4;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  *a;
  int local_50;
  true_ local_49;
  undefined1 local_48 [16];
  SVectorBase<double> *local_38;
  
  if ((SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
       *)this != sv) {
    iVar2 = sv->memused;
    local_38 = this;
    if (iVar2 == 0) {
      local_50 = 0;
    }
    else {
      a = sv->m_elem;
      local_50 = 0;
      pNVar3 = this->m_elem;
      do {
        local_48._0_10_ = (unkbyte10)0;
        bVar1 = boost::multiprecision::default_ops::
                eval_eq_imp<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,long_double>
                          ((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                            *)a,(longdouble *)local_48,&local_49);
        pNVar4 = pNVar3;
        if (!bVar1) {
          pNVar4 = pNVar3 + 1;
          local_48._0_10_ = (unkuint10)(ushort)local_48._8_2_ << 0x40;
          boost::multiprecision::detail::
          generic_convert_rational_to_float<double,boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>>
                    ((double *)local_48,
                     (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                      *)a);
          pNVar3->val = (double)local_48._0_8_;
          pNVar3->idx = a->idx;
          local_50 = local_50 + 1;
        }
        iVar2 = iVar2 + -1;
        a = a + 1;
        pNVar3 = pNVar4;
      } while (iVar2 != 0);
    }
    local_38->memused = local_50;
    this = local_38;
  }
  return this;
}

Assistant:

SVectorBase<R>& operator=(const SVectorBase<S>& sv)
   {
      if(this != (const SVectorBase<R>*)(&sv))
      {
         assert(max() >= sv.size());

         int i = sv.size();
         int nnz = 0;
         Nonzero<R>* e = m_elem;
         const Nonzero<S>* s = sv.m_elem;

         while(i--)
         {
            assert(e != nullptr);

            if(s->val != 0.0)
            {
               *e++ = *s;
               ++nnz;
            }

            ++s;
         }

         set_size(nnz);
      }

      return *this;
   }